

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  bVar1 = this->legitimate_message_end_;
  PopLimit(this,limit);
  failure_msg = absl::lts_20250127::log_internal::Check_LTImpl
                          (this->recursion_budget_,this->recursion_limit_,
                           "recursion_budget_ < recursion_limit_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this->recursion_budget_ = this->recursion_budget_ + 1;
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,0x9f,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  ABSL_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}